

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int feed_messages(ptls_t *tls,ptls_buffer_t *outbuf,size_t *out_epoch_offsets,uint8_t *input,
                 size_t *in_epoch_offsets,ptls_handshake_properties_t *props)

{
  bool bVar1;
  int iVar2;
  size_t in_epoch;
  size_t inlen;
  
  in_epoch = 0;
  outbuf->off = 0;
  out_epoch_offsets[4] = 0;
  out_epoch_offsets[2] = 0;
  out_epoch_offsets[3] = 0;
  *out_epoch_offsets = 0;
  out_epoch_offsets[1] = 0;
  iVar2 = 0x202;
  do {
    if (in_epoch == 4) {
      return iVar2;
    }
    bVar1 = true;
    inlen = in_epoch_offsets[in_epoch + 1] - in_epoch_offsets[in_epoch];
    if (((inlen != 0) &&
        (iVar2 = ptls_handle_message(tls,outbuf,out_epoch_offsets,in_epoch,
                                     input + in_epoch_offsets[in_epoch],inlen,props), iVar2 != 0x202
        )) && (iVar2 != 0)) {
      bVar1 = false;
    }
    in_epoch = in_epoch + 1;
  } while (bVar1);
  return iVar2;
}

Assistant:

static int feed_messages(ptls_t *tls, ptls_buffer_t *outbuf, size_t *out_epoch_offsets, const uint8_t *input,
                         const size_t *in_epoch_offsets, ptls_handshake_properties_t *props)
{
    size_t i;
    int ret = PTLS_ERROR_IN_PROGRESS;

    outbuf->off = 0;
    memset(out_epoch_offsets, 0, sizeof(*out_epoch_offsets) * 5);

    for (i = 0; i != 4; ++i) {
        size_t len = in_epoch_offsets[i + 1] - in_epoch_offsets[i];
        if (len != 0) {
            ret = ptls_handle_message(tls, outbuf, out_epoch_offsets, i, input + in_epoch_offsets[i], len, props);
            if (!(ret == 0 || ret == PTLS_ERROR_IN_PROGRESS))
                break;
        }
    }

    return ret;
}